

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_copy_to_file.cpp
# Opt level: O1

void __thiscall duckdb::LogicalCopyToFile::Serialize(LogicalCopyToFile *this,Serializer *serializer)

{
  copy_to_serialize_t p_Var1;
  type pFVar2;
  PreserveOrderType local_2b;
  bool local_2a;
  bool local_29;
  
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"file_path");
  (*serializer->_vptr_Serializer[0x1c])(serializer,&this->file_path);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"use_tmp_file");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->use_tmp_file);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WriteProperty<duckdb::FilenamePattern>
            (serializer,0xca,"filename_pattern",&this->filename_pattern);
  (*serializer->_vptr_Serializer[2])(serializer,0xcb,"overwrite_or_ignore");
  Serializer::WriteValue<duckdb::CopyOverwriteMode>(serializer,this->overwrite_mode);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xcc,"per_thread_output");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->per_thread_output);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xcd,"partition_output");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->partition_output);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xce,"partition_columns");
  Serializer::WriteValue<unsigned_long>(serializer,&this->partition_columns);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xcf,"names");
  Serializer::WriteValue<std::__cxx11::string>(serializer,&this->names);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xd0,"expected_types");
  Serializer::WriteValue<duckdb::LogicalType>(serializer,&this->expected_types);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xd1,"copy_info");
  Serializer::WriteValue<duckdb::CopyInfo>
            (serializer,
             (this->copy_info).
             super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
             super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xd2,"function_name");
  (*serializer->_vptr_Serializer[0x1c])(serializer,&(this->function).super_Function.name);
  (*serializer->_vptr_Serializer[3])(serializer);
  p_Var1 = (this->function).serialize;
  (*serializer->_vptr_Serializer[2])(serializer,0xd3,"function_has_serialize");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)(p_Var1 != (copy_to_serialize_t)0x0));
  (*serializer->_vptr_Serializer[3])(serializer);
  if (p_Var1 != (copy_to_serialize_t)0x0) {
    (*serializer->_vptr_Serializer[2])(serializer,0xd4,"function_data");
    (*serializer->_vptr_Serializer[6])(serializer);
    p_Var1 = (this->function).serialize;
    pFVar2 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*(&this->bind_data);
    (*p_Var1)(serializer,pFVar2,&this->function);
    (*serializer->_vptr_Serializer[7])(serializer);
    (*serializer->_vptr_Serializer[3])(serializer);
  }
  (*serializer->_vptr_Serializer[2])(serializer,0xd5,"file_extension");
  (*serializer->_vptr_Serializer[0x1c])(serializer,&this->file_extension);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xd6,"rotate");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->rotate);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xd7,"return_type");
  Serializer::WriteValue<duckdb::CopyFunctionReturnType>(serializer,this->return_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  local_29 = true;
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xd8,"write_partition_columns",&this->write_partition_columns,&local_29);
  local_2a = true;
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xd9,"write_empty_file",&this->write_empty_file,&local_2a);
  local_2b = AUTOMATIC;
  Serializer::WritePropertyWithDefault<duckdb::PreserveOrderType>
            (serializer,0xda,"preserve_order",&this->preserve_order,&local_2b);
  return;
}

Assistant:

void LogicalCopyToFile::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WriteProperty(200, "file_path", file_path);
	serializer.WriteProperty(201, "use_tmp_file", use_tmp_file);
	serializer.WriteProperty(202, "filename_pattern", filename_pattern);
	serializer.WriteProperty(203, "overwrite_or_ignore", overwrite_mode);
	serializer.WriteProperty(204, "per_thread_output", per_thread_output);
	serializer.WriteProperty(205, "partition_output", partition_output);
	serializer.WriteProperty(206, "partition_columns", partition_columns);
	serializer.WriteProperty(207, "names", names);
	serializer.WriteProperty(208, "expected_types", expected_types);
	serializer.WriteProperty(209, "copy_info", copy_info);

	// Serialize function
	serializer.WriteProperty(210, "function_name", function.name);

	bool has_serialize = function.serialize;
	serializer.WriteProperty(211, "function_has_serialize", has_serialize);
	if (has_serialize) {
		D_ASSERT(function.deserialize); // if serialize is set, deserialize should be set as well
		serializer.WriteObject(212, "function_data",
		                       [&](Serializer &obj) { function.serialize(obj, *bind_data, function); });
	}

	serializer.WriteProperty(213, "file_extension", file_extension);
	serializer.WriteProperty(214, "rotate", rotate);
	serializer.WriteProperty(215, "return_type", return_type);
	serializer.WritePropertyWithDefault(216, "write_partition_columns", write_partition_columns, true);
	serializer.WritePropertyWithDefault(217, "write_empty_file", write_empty_file, true);
	serializer.WritePropertyWithDefault(218, "preserve_order", preserve_order, PreserveOrderType::AUTOMATIC);
}